

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  int *aNew;
  int local_48;
  int nNew;
  int bDummy;
  int nPos;
  i64 iDelta;
  u8 *puStack_30;
  int iRowidOffset;
  u8 *a;
  int local_20;
  int i;
  int n;
  int eDetail;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  i = p->pConfig->eDetail;
  local_20 = pIter->pLeaf->szLeaf;
  a._4_4_ = pIter->iLeafOffset;
  puStack_30 = pIter->pLeaf->p;
  iDelta._4_4_ = 0;
  _n = pIter;
  pIter_local = (Fts5SegIter *)p;
  if (pIter->iEndofDoclist < local_20) {
    local_20 = pIter->iEndofDoclist;
  }
  do {
    _bDummy = 0;
    if (i == 1) {
      iVar2 = a._4_4_;
      if ((((a._4_4_ < local_20) && (puStack_30[a._4_4_] == '\0')) &&
          (iVar2 = a._4_4_ + 1, iVar2 < local_20)) && (puStack_30[iVar2] == '\0')) {
        iVar2 = a._4_4_ + 2;
      }
    }
    else {
      iVar2 = fts5GetPoslistSize(puStack_30 + a._4_4_,&nNew,&local_48);
      iVar2 = nNew + iVar2 + a._4_4_;
    }
    a._4_4_ = iVar2;
    if (local_20 <= a._4_4_) goto LAB_00274bb5;
    bVar1 = sqlite3Fts5GetVarint(puStack_30 + a._4_4_,(u64 *)&bDummy);
    a._4_4_ = (uint)bVar1 + a._4_4_;
    _n->iRowid = _bDummy + _n->iRowid;
    if (_n->nRowidOffset <= iDelta._4_4_) {
      iVar2 = _n->nRowidOffset + 8;
      piVar3 = (int *)sqlite3_realloc64(_n->aRowidOffset,(long)iVar2 << 2);
      if (piVar3 == (int *)0x0) {
        pIter_local->iTermLeafOffset = 7;
LAB_00274bb5:
        _n->iRowidOffset = iDelta._4_4_;
        fts5SegIterLoadNPos((Fts5Index *)pIter_local,_n);
        return;
      }
      _n->aRowidOffset = piVar3;
      _n->nRowidOffset = iVar2;
    }
    _n->aRowidOffset[iDelta._4_4_] = _n->iLeafOffset;
    _n->iLeafOffset = a._4_4_;
    iDelta._4_4_ = iDelta._4_4_ + 1;
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    i64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}